

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

string * ON_UTF_std_wstring_to_std_string
                   (int bTestByteOrder,wstring *sInputUTF,int sInputUTF_count,uint *error_status,
                   uint error_mask,ON__UINT32 error_code_point,int *end_element_index)

{
  uint uVar1;
  int sInputUTF_count_00;
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  string *this;
  undefined4 in_register_00000084;
  undefined4 *in_stack_00000010;
  undefined4 in_stack_ffffffffffffff7c;
  string local_60 [36];
  uint local_3c;
  undefined1 local_35;
  int sUTF_length;
  undefined4 *puStack_30;
  uint error_mask_local;
  uint *error_status_local;
  undefined8 uStack_20;
  int sInputUTF_count_local;
  wstring *sInputUTF_local;
  string *psStack_10;
  int bTestByteOrder_local;
  string *str;
  
  puStack_30 = (undefined4 *)CONCAT44(in_register_00000084,error_mask);
  this = (string *)CONCAT44(in_register_0000003c,bTestByteOrder);
  uStack_20 = CONCAT44(in_register_00000014,sInputUTF_count);
  sInputUTF_local._4_4_ = (uint)sInputUTF;
  error_status_local._4_4_ = (uint)error_status;
  local_35 = 0;
  sUTF_length = error_code_point;
  psStack_10 = this;
  std::__cxx11::string::string(this);
  local_3c = std::__cxx11::wstring::length();
  uVar1 = sInputUTF_local._4_4_;
  if ((int)local_3c < (int)error_status_local._4_4_) {
    if (in_stack_00000010 != (undefined4 *)0x0) {
      *in_stack_00000010 = 0;
    }
    if (puStack_30 != (undefined4 *)0x0) {
      *puStack_30 = 1;
    }
  }
  else {
    if (error_status_local._4_4_ == 0xffffffff) {
      error_status_local._4_4_ = local_3c;
    }
    sInputUTF_count_00 = std::__cxx11::wstring::c_str();
    ON_UTF_WideChar_to_std_string_abi_cxx11_
              ((int)local_60,(wchar_t *)(ulong)uVar1,sInputUTF_count_00,
               (uint *)(ulong)error_status_local._4_4_,(uint)puStack_30,sUTF_length,
               (int *)CONCAT44(in_stack_ffffffffffffff7c,end_element_index._0_4_));
    std::__cxx11::string::operator=(this,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return this;
}

Assistant:

std::string ON_UTF_std_wstring_to_std_string(
  int bTestByteOrder,
  const std::wstring& sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::string str;
  
  const int sUTF_length = static_cast<int>(sInputUTF.length());

  if ( sInputUTF_count > sUTF_length )
  {
    if ( 0 != end_element_index )
      *end_element_index = 0;
    if ( 0 != error_status )
      *error_status = 1;
    return str;
  }
  
  if ( -1 == sInputUTF_count )
    sInputUTF_count = sUTF_length;

  str = ON_UTF_WideChar_to_std_string(
    bTestByteOrder,
    sInputUTF.c_str(),
    sInputUTF_count,
    error_status,
    error_mask,
    error_code_point,
    end_element_index
    );

  return str;
}